

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

char * create_sampler_address_abi_cxx11_(char *prefix,MSLSamplerAddress addr)

{
  CompilerError *this;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  allocator local_41;
  string local_40 [40];
  char *pcStack_18;
  MSLSamplerAddress addr_local;
  char *prefix_local;
  
  pcStack_18 = (char *)CONCAT44(in_register_00000034,addr);
  prefix_local = prefix;
  switch(in_EDX) {
  case 0:
    spirv_cross::join<char_const*&,char_const(&)[23]>
              ((spirv_cross *)prefix,&stack0xffffffffffffffe8,
               (char (*) [23])"address::clamp_to_zero");
    break;
  case 1:
    spirv_cross::join<char_const*&,char_const(&)[23]>
              ((spirv_cross *)prefix,&stack0xffffffffffffffe8,
               (char (*) [23])"address::clamp_to_edge");
    break;
  case 2:
    spirv_cross::join<char_const*&,char_const(&)[25]>
              ((spirv_cross *)prefix,&stack0xffffffffffffffe8,
               (char (*) [25])"address::clamp_to_border");
    break;
  case 3:
    spirv_cross::join<char_const*&,char_const(&)[16]>
              ((spirv_cross *)prefix,&stack0xffffffffffffffe8,(char (*) [16])"address::repeat");
    break;
  case 4:
    spirv_cross::join<char_const*&,char_const(&)[25]>
              ((spirv_cross *)prefix,&stack0xffffffffffffffe8,
               (char (*) [25])"address::mirrored_repeat");
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Invalid sampler addressing mode.",&local_41);
    spirv_cross::CompilerError::CompilerError(this,(string *)local_40);
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  return prefix;
}

Assistant:

static string create_sampler_address(const char *prefix, MSLSamplerAddress addr)
{
	switch (addr)
	{
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE:
		return join(prefix, "address::clamp_to_edge");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_ZERO:
		return join(prefix, "address::clamp_to_zero");
	case MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER:
		return join(prefix, "address::clamp_to_border");
	case MSL_SAMPLER_ADDRESS_REPEAT:
		return join(prefix, "address::repeat");
	case MSL_SAMPLER_ADDRESS_MIRRORED_REPEAT:
		return join(prefix, "address::mirrored_repeat");
	default:
		SPIRV_CROSS_THROW("Invalid sampler addressing mode.");
	}
}